

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_int8.h
# Opt level: O3

void ncnn::conv3x3s1_winograd23_int8_sse(Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Option *opt)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  size_t sVar5;
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  undefined1 auVar16 [14];
  undefined1 auVar17 [14];
  undefined1 auVar18 [14];
  undefined1 auVar19 [14];
  undefined1 auVar20 [14];
  undefined1 auVar21 [14];
  undefined1 auVar22 [14];
  undefined1 auVar23 [14];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [14];
  undefined1 auVar28 [14];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [14];
  undefined1 auVar33 [14];
  undefined1 auVar34 [14];
  undefined1 auVar35 [14];
  undefined1 auVar36 [14];
  undefined1 auVar37 [14];
  undefined1 auVar38 [14];
  undefined1 auVar39 [14];
  undefined1 auVar40 [14];
  undefined1 auVar41 [14];
  undefined1 auVar42 [14];
  undefined1 auVar43 [14];
  undefined1 auVar44 [14];
  undefined1 auVar45 [14];
  undefined1 auVar46 [14];
  undefined1 auVar47 [14];
  undefined1 auVar48 [14];
  undefined1 auVar49 [14];
  undefined1 auVar50 [14];
  undefined1 auVar51 [14];
  undefined1 auVar52 [14];
  undefined1 auVar53 [14];
  undefined1 auVar54 [14];
  undefined1 auVar55 [14];
  undefined1 auVar56 [14];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [14];
  undefined1 auVar61 [14];
  undefined1 auVar62 [14];
  undefined1 auVar63 [14];
  undefined1 auVar64 [14];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [14];
  undefined1 auVar69 [14];
  undefined1 auVar70 [15];
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [14];
  undefined1 auVar74 [14];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined8 uVar81;
  undefined1 auVar82 [12];
  undefined1 auVar83 [14];
  undefined1 auVar84 [12];
  undefined1 auVar85 [14];
  undefined1 auVar86 [12];
  undefined1 auVar87 [14];
  undefined1 auVar88 [12];
  undefined1 auVar89 [14];
  undefined1 auVar90 [14];
  undefined1 auVar91 [14];
  undefined1 auVar92 [14];
  undefined1 auVar93 [14];
  undefined1 auVar94 [14];
  undefined1 auVar95 [14];
  undefined1 auVar96 [14];
  undefined1 auVar97 [14];
  undefined1 auVar98 [14];
  undefined1 auVar99 [14];
  undefined1 auVar100 [14];
  undefined1 auVar101 [14];
  undefined1 auVar102 [12];
  undefined1 auVar103 [14];
  undefined1 auVar104 [14];
  undefined1 auVar105 [14];
  undefined1 auVar106 [14];
  undefined1 auVar107 [14];
  undefined1 auVar108 [14];
  undefined1 auVar109 [14];
  undefined1 auVar110 [14];
  undefined1 auVar111 [14];
  undefined1 auVar112 [16];
  undefined1 auVar113 [12];
  undefined1 auVar114 [12];
  undefined1 auVar115 [12];
  undefined1 auVar116 [12];
  undefined6 uVar117;
  int i;
  long lVar118;
  long lVar119;
  void *pvVar120;
  long lVar121;
  void *pvVar122;
  int iVar123;
  void *pvVar124;
  Allocator *pAVar125;
  uint uVar126;
  undefined4 *puVar127;
  long lVar128;
  void *pvVar129;
  ulong uVar130;
  ulong uVar131;
  void *pvVar132;
  uint uVar133;
  long lVar134;
  long lVar135;
  void *pvVar136;
  long lVar137;
  void *pvVar138;
  void *pvVar139;
  void *pvVar140;
  undefined4 *puVar141;
  undefined8 *puVar142;
  undefined4 *puVar143;
  short asVar144 [4];
  undefined8 *puVar145;
  long lVar146;
  ulong uVar147;
  long lVar148;
  uint uVar149;
  undefined4 *puVar150;
  ulong uVar151;
  int iVar152;
  int iVar153;
  int iVar166;
  undefined1 auVar154 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  short sVar191;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  ushort uVar208;
  short sVar209;
  short sVar210;
  ushort uVar211;
  undefined1 in_XMM3 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar207 [16];
  undefined4 uVar212;
  undefined1 in_XMM4 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar225 [16];
  undefined4 uVar229;
  short sVar239;
  short sVar241;
  uint uVar240;
  undefined1 in_XMM5 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  short sVar256;
  short sVar257;
  undefined1 auVar242 [12];
  undefined1 auVar243 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar258 [12];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar264 [12];
  undefined1 auVar265 [16];
  void *local_330;
  void *local_328;
  void *local_318;
  long local_308;
  void *local_300;
  void *ptr;
  undefined8 uStack_2f0;
  void *pvStack_2e8;
  int iStack_2e0;
  undefined4 uStack_2dc;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  int *local_2b0;
  void *local_2a8;
  void *local_2a0;
  uint local_294;
  ulong local_290;
  void *local_288;
  void *local_280;
  void *local_278;
  Allocator *local_270;
  void *local_268;
  uint local_25c;
  int *local_258;
  Option *local_250;
  Mat *local_248;
  void *local_240;
  void *local_238;
  void *local_230;
  void *local_228;
  void *local_220;
  Allocator *local_218;
  ulong local_210;
  long local_208;
  void *local_200;
  ulong local_1f8;
  ulong local_1f0;
  void *local_1e8;
  void *local_1e0;
  void *local_1d8;
  void *local_1d0;
  long local_1c8;
  void *local_1c0;
  ulong local_1b8;
  uint local_1ac;
  Mat local_1a8;
  int o1 [2];
  int o0 [2];
  short d1 [4];
  undefined8 uStack_150;
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  Mat *local_118;
  ulong local_110;
  long local_108;
  size_t local_100;
  long local_f8;
  int local_f0;
  int local_ec;
  short d2 [4];
  int aiStack_e0 [2];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  short d3 [4];
  int aiStack_a0 [2];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  int s3 [4];
  Option opt_b;
  undefined1 auVar155 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined2 uVar165;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 uVar188;
  undefined1 uVar189;
  undefined1 uVar190;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar196 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  short sVar238;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar249 [16];
  undefined1 auVar246 [16];
  undefined1 auVar250 [16];
  short sVar262;
  short sVar263;
  undefined1 auVar266 [16];
  
  uVar4 = bottom_blob->c;
  lVar134 = (long)(int)uVar4;
  uVar126 = top_blob->w;
  local_1b8 = (ulong)uVar126;
  uVar149 = top_blob->h;
  local_1f0 = (ulong)uVar149;
  local_268 = (void *)(ulong)(uint)top_blob->c;
  local_1a8.data = bottom_blob->data;
  local_1a8.refcount = bottom_blob->refcount;
  local_1a8.elemsize = bottom_blob->elemsize;
  local_1a8.elempack = bottom_blob->elempack;
  local_1a8.allocator = bottom_blob->allocator;
  iVar152 = bottom_blob->w;
  local_1a8.dims = bottom_blob->dims;
  local_1a8.w = bottom_blob->w;
  iVar153 = bottom_blob->h;
  local_1a8.h = bottom_blob->h;
  local_1a8.c = bottom_blob->c;
  local_1a8.cstep = bottom_blob->cstep;
  if (local_1a8.refcount != (int *)0x0) {
    LOCK();
    *local_1a8.refcount = *local_1a8.refcount + 1;
    UNLOCK();
    iVar152 = bottom_blob->w;
    iVar153 = bottom_blob->h;
  }
  uVar126 = (uVar126 - ((int)(uVar126 + 1) >> 0x1f)) + 1;
  uVar133 = uVar126 & 0xfffffffe;
  local_110 = (ulong)uVar133;
  uVar149 = (uVar149 - ((int)(uVar149 + 1) >> 0x1f)) + 1;
  local_1ac = uVar149 & 0xfffffffe;
  iVar123 = uVar133 + 2;
  opt_b.use_int8_arithmetic = opt->use_int8_arithmetic;
  opt_b.use_packing_layout = opt->use_packing_layout;
  opt_b.use_shader_pack8 = opt->use_shader_pack8;
  opt_b.use_bf16_storage = opt->use_bf16_storage;
  opt_b._36_4_ = *(undefined4 *)&opt->field_0x24;
  opt_b.lightmode = opt->lightmode;
  opt_b._1_3_ = *(undefined3 *)&opt->field_0x1;
  opt_b.num_threads = opt->num_threads;
  opt_b.workspace_allocator = opt->workspace_allocator;
  opt_b.use_winograd_convolution = opt->use_winograd_convolution;
  opt_b.use_sgemm_convolution = opt->use_sgemm_convolution;
  opt_b.use_int8_inference = opt->use_int8_inference;
  opt_b.use_vulkan_compute = opt->use_vulkan_compute;
  opt_b.use_fp16_packed = opt->use_fp16_packed;
  opt_b.use_fp16_storage = opt->use_fp16_storage;
  opt_b.use_fp16_arithmetic = opt->use_fp16_arithmetic;
  opt_b.use_int8_storage = opt->use_int8_storage;
  opt_b.blob_allocator = opt->workspace_allocator;
  local_250 = opt;
  local_248 = kernel_tm;
  local_118 = top_blob;
  copy_make_border(bottom_blob,&local_1a8,0,(local_1ac - iVar153) + 2,0,iVar123 - iVar152,0,0.0,
                   &opt_b);
  local_25c = (int)uVar126 >> 1;
  uVar149 = (int)uVar149 >> 1;
  local_294 = uVar149 * local_25c;
  local_270 = opt->workspace_allocator;
  local_290 = (ulong)(int)(local_294 * 0x10);
  lVar146 = (local_290 & 0x7ffffffffffffff0) * lVar134;
  if (lVar146 == 0) {
    local_2b0 = (int *)0x0;
    local_330 = (void *)0x0;
  }
  else {
    sVar1 = lVar146 * 2 + 4;
    if (local_270 == (Allocator *)0x0) {
      local_330 = (void *)0x0;
      ptr = (void *)0x0;
      iVar152 = posix_memalign(&ptr,0x10,sVar1);
      if (iVar152 == 0) {
        local_330 = ptr;
      }
    }
    else {
      local_330 = (void *)(**(code **)(*(long *)local_270 + 0x10))(local_270,sVar1);
    }
    local_2b0 = (int *)((long)local_330 + lVar146 * 2);
    *(undefined4 *)((long)local_330 + lVar146 * 2) = 1;
  }
  auVar216 = _DAT_0016dff0;
  if (0 < (int)uVar4) {
    local_2a0 = local_1a8.data;
    lVar146 = (long)iVar123;
    uVar126 = 1;
    if (1 < (int)local_25c) {
      uVar126 = local_25c;
    }
    uVar131 = 1;
    if (1 < (int)uVar149) {
      uVar131 = (ulong)uVar149;
    }
    lVar137 = 0;
    do {
      if (0 < (int)local_1f0) {
        pvVar140 = (void *)(local_290 * 2 * lVar137 + (long)local_330);
        uVar147 = 0;
        do {
          if (0 < (int)local_1b8) {
            puVar150 = (undefined4 *)
                       ((long)local_1a8.data +
                       (long)(iVar123 * 2 * (int)uVar147) +
                       local_1a8.cstep * local_1a8.elemsize * lVar137);
            puVar141 = (undefined4 *)((long)puVar150 + lVar146);
            puVar143 = (undefined4 *)((long)puVar141 + lVar146);
            puVar127 = (undefined4 *)(lVar146 + (long)puVar143);
            uVar133 = 0;
            do {
              auVar154 = _d3;
              uVar212 = *puVar150;
              auVar6[0xd] = 0;
              auVar6._0_13_ = in_XMM3._0_13_;
              auVar6[0xe] = in_XMM3[7];
              auVar29[0xc] = in_XMM3[6];
              auVar29._0_12_ = in_XMM3._0_12_;
              auVar29._13_2_ = auVar6._13_2_;
              auVar57[0xb] = 0;
              auVar57._0_11_ = in_XMM3._0_11_;
              auVar57._12_3_ = auVar29._12_3_;
              auVar65[10] = in_XMM3[5];
              auVar65._0_10_ = in_XMM3._0_10_;
              auVar65._11_4_ = auVar57._11_4_;
              auVar70[9] = 0;
              auVar70._0_9_ = in_XMM3._0_9_;
              auVar70._10_5_ = auVar65._10_5_;
              auVar75[8] = in_XMM3[4];
              auVar75._0_8_ = in_XMM3._0_8_;
              auVar75._9_6_ = auVar70._9_6_;
              auVar192._8_7_ = auVar75._8_7_;
              auVar192[7] = (char)((uint)uVar212 >> 0x18);
              auVar192[6] = in_XMM3[3];
              auVar192[5] = (char)((uint)uVar212 >> 0x10);
              auVar192[4] = in_XMM3[2];
              auVar192[3] = (char)((uint)uVar212 >> 8);
              auVar192[2] = in_XMM3[1];
              auVar192[0] = in_XMM3[0];
              auVar192[1] = (char)uVar212;
              auVar192[0xf] = 0;
              auVar193 = psraw(auVar192,8);
              uVar212 = *puVar141;
              auVar7[0xd] = 0;
              auVar7._0_13_ = in_XMM4._0_13_;
              auVar7[0xe] = in_XMM4[7];
              auVar30[0xc] = in_XMM4[6];
              auVar30._0_12_ = in_XMM4._0_12_;
              auVar30._13_2_ = auVar7._13_2_;
              auVar58[0xb] = 0;
              auVar58._0_11_ = in_XMM4._0_11_;
              auVar58._12_3_ = auVar30._12_3_;
              auVar66[10] = in_XMM4[5];
              auVar66._0_10_ = in_XMM4._0_10_;
              auVar66._11_4_ = auVar58._11_4_;
              auVar71[9] = 0;
              auVar71._0_9_ = in_XMM4._0_9_;
              auVar71._10_5_ = auVar66._10_5_;
              auVar76[8] = in_XMM4[4];
              auVar76._0_8_ = in_XMM4._0_8_;
              auVar76._9_6_ = auVar71._9_6_;
              auVar213._8_7_ = auVar76._8_7_;
              auVar213[7] = (char)((uint)uVar212 >> 0x18);
              auVar213[6] = in_XMM4[3];
              auVar213[5] = (char)((uint)uVar212 >> 0x10);
              auVar213[4] = in_XMM4[2];
              auVar213[3] = (char)((uint)uVar212 >> 8);
              auVar213[2] = in_XMM4[1];
              auVar213[0] = in_XMM4[0];
              auVar213[1] = (char)uVar212;
              auVar213[0xf] = 0;
              auVar214 = psraw(auVar213,8);
              uVar212 = *puVar143;
              auVar8[0xd] = 0;
              auVar8._0_13_ = in_XMM5._0_13_;
              auVar8[0xe] = in_XMM5[7];
              auVar31[0xc] = in_XMM5[6];
              auVar31._0_12_ = in_XMM5._0_12_;
              auVar31._13_2_ = auVar8._13_2_;
              auVar59[0xb] = 0;
              auVar59._0_11_ = in_XMM5._0_11_;
              auVar59._12_3_ = auVar31._12_3_;
              auVar67[10] = in_XMM5[5];
              auVar67._0_10_ = in_XMM5._0_10_;
              auVar67._11_4_ = auVar59._11_4_;
              auVar72[9] = 0;
              auVar72._0_9_ = in_XMM5._0_9_;
              auVar72._10_5_ = auVar67._10_5_;
              auVar77[8] = in_XMM5[4];
              auVar77._0_8_ = in_XMM5._0_8_;
              auVar77._9_6_ = auVar72._9_6_;
              auVar230._8_7_ = auVar77._8_7_;
              auVar230[7] = (char)((uint)uVar212 >> 0x18);
              auVar230[6] = in_XMM5[3];
              auVar230[5] = (char)((uint)uVar212 >> 0x10);
              auVar230[4] = in_XMM5[2];
              auVar230[3] = (char)((uint)uVar212 >> 8);
              auVar230[2] = in_XMM5[1];
              auVar230[0] = in_XMM5[0];
              auVar230[1] = (char)uVar212;
              auVar230[0xf] = 0;
              auVar231 = psraw(auVar230,8);
              uVar212 = *puVar127;
              uVar190 = (undefined1)((uint)uVar212 >> 0x18);
              uVar189 = (undefined1)((uint)uVar212 >> 0x10);
              uVar188 = (undefined1)((uint)uVar212 >> 8);
              auVar167._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar190,uVar190),uVar189),
                                  CONCAT14(uVar189,uVar212)) >> 0x20);
              auVar167[3] = uVar188;
              auVar167[2] = uVar188;
              auVar167[0] = (undefined1)uVar212;
              auVar167[1] = auVar167[0];
              auVar167._8_8_ = 0;
              auVar168 = psraw(auVar167,8);
              sVar191 = auVar231._0_2_;
              auVar197._0_2_ = auVar193._0_2_ - sVar191;
              sVar238 = auVar231._2_2_;
              uVar208 = auVar193._2_2_ - sVar238;
              sVar239 = auVar231._4_2_;
              sVar209 = auVar193._4_2_ - sVar239;
              sVar241 = auVar231._6_2_;
              sVar210 = auVar193._6_2_ - sVar241;
              uVar212 = CONCAT22(sVar210,sVar209);
              uVar211 = auVar193._10_2_ - auVar231._10_2_;
              sVar256 = auVar214._0_2_;
              auVar258._0_2_ = sVar256 + sVar191;
              sVar257 = auVar214._2_2_;
              auVar258._2_2_ = sVar257 + sVar238;
              sVar262 = auVar214._4_2_;
              auVar258._4_2_ = sVar262 + sVar239;
              sVar263 = auVar214._6_2_;
              auVar258._6_2_ = sVar263 + sVar241;
              auVar258._8_2_ = auVar214._8_2_ + auVar231._8_2_;
              auVar258._10_2_ = auVar214._10_2_ + auVar231._10_2_;
              sVar238 = sVar238 - sVar257;
              uVar229 = CONCAT22(sVar238,sVar191 - sVar256);
              sVar241 = sVar241 - sVar263;
              auVar231._0_2_ = auVar168._0_2_ - sVar256;
              auVar231._2_2_ = auVar168._2_2_ - sVar257;
              auVar231._4_2_ = auVar168._4_2_ - sVar262;
              auVar231._6_2_ = auVar168._6_2_ - sVar263;
              auVar231._8_2_ = auVar168._8_2_ - auVar214._8_2_;
              auVar231._10_2_ = auVar168._10_2_ - auVar214._10_2_;
              auVar231._12_2_ = auVar168._12_2_ - auVar214._12_2_;
              auVar231._14_2_ = auVar168._14_2_ - auVar214._14_2_;
              auVar264._2_2_ = 0;
              auVar264._0_2_ = uVar208;
              auVar264._4_2_ = sVar210;
              auVar264._6_2_ = 0;
              auVar264._8_4_ = (uint)(((ulong)uVar211 << 0x30) >> 0x30);
              auVar242._0_8_ = CONCAT44(uVar212,uVar212);
              auVar242._8_4_ = uVar212;
              uVar117 = CONCAT24(auVar258._6_2_,CONCAT22(sVar210,uVar211));
              auVar116._2_4_ = (int)((uint6)uVar117 >> 0x10);
              auVar116._0_2_ = auVar258._4_2_;
              auVar116._6_6_ = 0;
              auVar113._2_2_ = auVar258._2_2_;
              auVar113._0_2_ = sVar209;
              auVar113._4_8_ = SUB128(auVar116 << 0x30,4);
              auVar78._2_10_ = auVar113._2_10_;
              auVar78._0_2_ = uVar208;
              auVar194._0_8_ = auVar78._0_8_ << 0x20;
              auVar264 = auVar258 & SUB1612(ZEXT416(0xffff0000),0) | auVar264;
              auVar246._12_2_ = sVar210;
              auVar246._0_12_ = auVar242;
              auVar246._14_2_ = auVar258._6_2_;
              auVar245._12_4_ = auVar246._12_4_;
              auVar245._0_10_ = auVar242._0_10_;
              auVar245._10_2_ = auVar258._4_2_;
              auVar244._10_6_ = auVar245._10_6_;
              auVar244._8_2_ = sVar209;
              auVar244._0_8_ = auVar242._0_8_;
              auVar243._8_8_ = auVar244._8_8_;
              auVar243._6_2_ = auVar258._6_2_;
              auVar243._4_2_ = sVar210;
              auVar243._0_4_ = uVar212;
              auVar247._0_8_ = auVar243._4_8_ << 0x20;
              uVar212 = CONCAT22(auVar258._6_2_,sVar210);
              uVar240 = (uint)(CONCAT26(sVar241,CONCAT24(sVar239 - sVar262,uVar229)) >> 0x20);
              auVar194._8_4_ = auVar78._0_4_;
              auVar194._12_4_ = uVar240;
              auVar193._4_8_ = auVar194._8_8_;
              auVar193._0_4_ = uVar229;
              auVar193._12_4_ = 0;
              auVar168._4_4_ = uVar240 >> 0x10;
              auVar168._0_4_ = auVar264._4_4_;
              auVar168._8_8_ = 0;
              auVar247._8_4_ = auVar243._4_4_;
              auVar247._12_4_ = uVar240;
              auVar214._4_8_ = auVar247._8_8_;
              auVar214._0_4_ = uVar240;
              auVar214._12_4_ = 0;
              auVar196._0_12_ = SUB1612(auVar193 << 0x20,0);
              auVar196._12_2_ = sVar238;
              auVar196._14_2_ = auVar231._6_2_;
              auVar195._12_4_ = auVar196._12_4_;
              auVar195._0_10_ = SUB1610(auVar193 << 0x20,0);
              auVar195._10_2_ = auVar231._4_2_;
              auVar114._4_2_ = sVar191 - sVar256;
              auVar114._0_4_ = uVar229;
              auVar114._6_6_ = auVar195._10_6_;
              auVar79._4_8_ = auVar114._4_8_;
              auVar79._2_2_ = auVar231._2_2_;
              auVar79._0_2_ = auVar258._0_2_;
              auVar197._2_2_ = auVar231._0_2_;
              auVar197._8_4_ = auVar114._4_4_;
              auVar197._4_4_ = auVar195._12_4_;
              auVar197._12_4_ = auVar79._0_4_;
              auVar193 = pshufhw(auVar197,auVar197,0xe8);
              auVar198._0_4_ = auVar193._0_4_;
              auVar198._8_4_ = auVar193._8_4_;
              auVar198._12_4_ = auVar193._12_4_;
              auVar198._4_4_ = auVar198._8_4_;
              auVar193 = pshuflw(auVar198,auVar198,0x6c);
              auVar266._0_12_ = SUB1612(auVar168 << 0x40,0);
              auVar266._12_2_ = 0;
              auVar266._14_2_ = auVar231._6_2_;
              auVar265._12_4_ = auVar266._12_4_;
              auVar265._0_10_ = SUB1610(auVar168 << 0x40,0);
              auVar265._10_2_ = auVar231._4_2_;
              uVar81 = CONCAT62(auVar265._10_6_,sVar238);
              auVar80._4_8_ = uVar81;
              auVar80._2_2_ = auVar231._2_2_;
              auVar80._0_2_ = auVar264._2_2_;
              auVar232._14_2_ = auVar231._0_2_;
              auVar232._12_2_ = auVar264._0_2_;
              auVar232._4_4_ = auVar80._0_4_;
              auVar232._0_4_ = auVar265._12_4_;
              auVar232._8_4_ = (int)uVar81;
              auVar168 = pshufhw(auVar232,auVar232,0xe8);
              auVar233._4_4_ = auVar168._4_4_;
              auVar233._8_4_ = auVar168._8_4_;
              auVar233._12_4_ = auVar168._12_4_;
              auVar233._0_4_ = auVar233._8_4_;
              in_XMM5 = pshuflw(auVar233,auVar233,0xc9);
              auVar250._0_12_ = SUB1612(auVar214 << 0x20,0);
              auVar250._12_2_ = sVar241;
              auVar250._14_2_ = auVar231._6_2_;
              auVar249._12_4_ = auVar250._12_4_;
              auVar249._0_10_ = SUB1610(auVar214 << 0x20,0);
              auVar249._10_2_ = auVar231._4_2_;
              auVar115._4_2_ = sVar239 - sVar262;
              auVar115._0_4_ = uVar240;
              auVar115._6_6_ = auVar249._10_6_;
              auVar248._8_8_ = auVar115._4_8_;
              auVar248._6_2_ = auVar231._2_2_;
              auVar248._4_2_ = auVar258._4_2_;
              auVar248._2_2_ = auVar231._0_2_;
              auVar248._0_2_ = sVar209;
              auVar168 = pshuflw(auVar248,auVar248,0xe8);
              in_XMM4 = ZEXT616(CONCAT24(sVar241,uVar212)) & auVar216;
              auVar214 = ~auVar216 & auVar231 | in_XMM4;
              sVar239 = auVar168._0_2_;
              sVar241 = auVar168._2_2_;
              sVar256 = auVar168._8_2_;
              sVar257 = auVar168._10_2_;
              in_XMM3._0_8_ =
                   (void *)CONCAT26(auVar193._6_2_ - sVar257,
                                    CONCAT24(auVar193._4_2_ - sVar256,
                                             CONCAT22(auVar193._2_2_ - sVar241,
                                                      auVar193._0_2_ - sVar239)));
              in_XMM3._8_2_ = auVar193._8_2_ - sVar256;
              in_XMM3._10_2_ = auVar193._10_2_ - sVar257;
              in_XMM3._12_2_ = auVar193._12_2_ - auVar168._12_2_;
              in_XMM3._14_2_ = auVar193._14_2_ - auVar168._14_2_;
              ptr = in_XMM3._0_8_;
              sVar209 = in_XMM5._0_2_;
              sVar210 = in_XMM5._2_2_;
              d1[1] = sVar210 + sVar241;
              d1[0] = sVar209 + sVar239;
              sVar191 = in_XMM5._4_2_;
              d1[2] = sVar191 + sVar256;
              sVar238 = in_XMM5._6_2_;
              d1[3] = sVar238 + sVar257;
              d2[1] = sVar241 - sVar210;
              d2[0] = sVar239 - sVar209;
              d2[2] = sVar256 - sVar191;
              d2[3] = sVar257 - sVar238;
              d3[1] = auVar214._2_2_ - sVar210;
              d3[0] = auVar214._0_2_ - sVar209;
              d3[2] = auVar214._4_2_ - sVar191;
              d3[3] = auVar214._6_2_ - sVar238;
              aiStack_a0 = auVar154._8_8_;
              lVar135 = 0;
              do {
                *(undefined2 *)((long)pvVar140 + lVar135) = *(undefined2 *)((long)&ptr + lVar135);
                *(undefined2 *)((long)pvVar140 + lVar135 + 8) = *(undefined2 *)((long)d1 + lVar135);
                *(undefined2 *)((long)pvVar140 + lVar135 + 0x10) =
                     *(undefined2 *)((long)d2 + lVar135);
                *(undefined2 *)((long)pvVar140 + lVar135 + 0x18) =
                     *(undefined2 *)((long)d3 + lVar135);
                lVar135 = lVar135 + 2;
              } while (lVar135 != 8);
              puVar150 = (undefined4 *)((long)puVar150 + 2);
              puVar141 = (undefined4 *)((long)puVar141 + 2);
              puVar143 = (undefined4 *)((long)puVar143 + 2);
              puVar127 = (undefined4 *)((long)puVar127 + 2);
              pvVar140 = (void *)((long)pvVar140 + 0x20);
              uVar133 = uVar133 + 1;
            } while (uVar133 != uVar126);
          }
          uVar147 = uVar147 + 1;
        } while (uVar147 != uVar131);
      }
      lVar137 = lVar137 + 1;
    } while (lVar137 != lVar134);
  }
  pvStack_2e8 = (void *)0x0;
  iStack_2e0 = 0;
  ptr = (void *)0x0;
  uStack_2f0._0_4_ = 0;
  uStack_2f0._4_4_ = 0;
  local_2d8 = (undefined1  [16])0x0;
  local_2c8 = (undefined1  [16])0x0;
  if (local_1a8.refcount != (int *)0x0) {
    LOCK();
    *local_1a8.refcount = *local_1a8.refcount + -1;
    UNLOCK();
    if (*local_1a8.refcount == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if (local_1a8.data != (void *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_1a8.allocator + 0x18))();
      }
    }
  }
  auVar168 = local_2c8;
  auVar216 = local_2d8;
  local_1a8.refcount = (int *)CONCAT44(uStack_2f0._4_4_,(undefined4)uStack_2f0);
  local_1a8.data = ptr;
  local_1a8.elemsize = (size_t)pvStack_2e8;
  local_1a8.elempack = iStack_2e0;
  local_1a8.allocator = (Allocator *)local_2d8._0_8_;
  local_1a8.dims = local_2d8._8_4_;
  local_1a8.w = local_2d8._12_4_;
  local_1a8.h = local_2c8._0_4_;
  local_1a8.c = local_2c8._4_4_;
  local_2c8._8_8_ = auVar168._8_8_;
  local_1a8.cstep = local_2c8._8_8_;
  local_2c8 = auVar168;
  if (local_1a8.refcount != (int *)0x0) {
    LOCK();
    *local_1a8.refcount = *local_1a8.refcount + -1;
    UNLOCK();
    if (*local_1a8.refcount == 0) {
      local_2d8 = auVar216;
      if ((Allocator *)local_2d8._0_8_ == (Allocator *)0x0) {
        if (ptr != (void *)0x0) {
          free(ptr);
          auVar216 = local_2d8;
        }
      }
      else {
        lVar146 = *(long *)local_2d8._0_8_;
        (**(code **)(lVar146 + 0x18))();
        auVar216 = local_2d8;
      }
    }
  }
  local_2d8 = auVar216;
  local_210 = (ulong)(int)local_268;
  local_218 = local_250->workspace_allocator;
  lVar146 = (local_290 & 0x3ffffffffffffff0) * local_210;
  if (lVar146 == 0) {
    local_258 = (int *)0x0;
    local_328 = (void *)0x0;
  }
  else {
    sVar1 = lVar146 * 4 + 4;
    if (local_218 == (Allocator *)0x0) {
      local_328 = (void *)0x0;
      ptr = (void *)0x0;
      iVar152 = posix_memalign(&ptr,0x10,sVar1);
      if (iVar152 == 0) {
        local_328 = ptr;
      }
    }
    else {
      local_328 = (void *)(**(code **)(*(long *)local_218 + 0x10))(local_218,sVar1);
    }
    local_258 = (int *)((long)local_328 + lVar146 * 4);
    *(undefined4 *)((long)local_328 + lVar146 * 4) = 1;
  }
  uVar126 = (int)local_210 >> 2;
  local_1f8 = local_210 & 0xfffffffffffffffc;
  local_220 = (void *)(ulong)local_294;
  if (0 < (int)uVar126) {
    pvVar140 = local_248->data;
    local_100 = local_248->elemsize;
    local_1c8 = local_290 * 2;
    local_200 = (void *)(ulong)uVar126;
    lVar146 = local_290 * 8;
    lVar137 = local_248->cstep * local_100;
    local_208 = lVar137 * 4;
    local_108 = local_100 * 4;
    local_1d0 = (void *)((long)local_330 + local_290 * 2);
    local_1d8 = (void *)((long)local_330 + local_290 * 4);
    local_1e0 = (void *)((long)local_330 + local_290 * 6);
    local_278 = (void *)(lVar137 * 3 + (long)pvVar140);
    local_288 = (void *)((long)local_328 + local_290 * 0xc);
    local_f8 = local_290 * 0x10;
    local_280 = (void *)(lVar137 + (long)pvVar140);
    local_228 = (void *)((long)pvVar140 + lVar137 * 2);
    local_230 = (void *)((long)local_328 + local_290 * 8);
    local_238 = (void *)((long)local_328 + local_290 * 4);
    local_240 = local_328;
    pvVar122 = (void *)0x0;
    do {
      local_1e8 = pvVar122;
      if (0 < (int)local_294) {
        lVar135 = local_100 * (long)local_248->w;
        local_2a0 = (void *)(local_248->w * local_108);
        pvVar122 = local_240;
        pvVar124 = local_230;
        pvVar129 = local_238;
        pvVar136 = local_288;
        pvVar138 = (void *)0x0;
        do {
          local_2a8 = pvVar138;
          uVar147 = (ulong)(uint)((int)local_2a8 << 5);
          uVar131 = 0;
          local_2c8 = (undefined1  [16])0x0;
          local_2d8 = (undefined1  [16])0x0;
          pvStack_2e8 = (void *)0x0;
          iStack_2e0 = 0;
          uStack_2dc = 0;
          ptr = (void *)0x0;
          uStack_2f0._0_4_ = 0;
          uStack_2f0._4_4_ = 0;
          local_128 = (undefined1  [16])0x0;
          local_138 = (undefined1  [16])0x0;
          local_148 = (undefined1  [16])0x0;
          _d1 = (undefined1  [16])0x0;
          local_b8 = (undefined1  [16])0x0;
          local_c8 = (undefined1  [16])0x0;
          local_d8 = (undefined1  [16])0x0;
          _d2 = (undefined1  [16])0x0;
          local_78 = (undefined1  [16])0x0;
          local_88 = (undefined1  [16])0x0;
          local_98 = (undefined1  [16])0x0;
          _d3 = (undefined1  [16])0x0;
          if (3 < (int)uVar4) {
            lVar119 = (long)local_330 + uVar147;
            lVar121 = (long)local_1d0 + uVar147;
            lVar118 = (long)local_1d8 + uVar147;
            lVar128 = (long)local_1e0 + uVar147;
            uVar151 = 0;
            pvVar138 = pvVar140;
            do {
              lVar148 = 0;
              do {
                uVar131 = *(ulong *)(lVar119 + lVar148);
                uVar165 = (undefined2)(uVar131 >> 0x30);
                auVar155._8_4_ = 0;
                auVar155._0_8_ = uVar131;
                auVar155._12_2_ = uVar165;
                auVar155._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar131 >> 0x20);
                auVar154._12_4_ = auVar155._12_4_;
                auVar154._8_2_ = 0;
                auVar154._0_8_ = uVar131;
                auVar154._10_2_ = uVar165;
                auVar216._10_6_ = auVar154._10_6_;
                auVar216._8_2_ = uVar165;
                auVar216._0_8_ = uVar131;
                uVar165 = (undefined2)(uVar131 >> 0x10);
                auVar82._4_8_ = auVar216._8_8_;
                auVar82._2_2_ = uVar165;
                auVar82._0_2_ = uVar165;
                auVar156._0_4_ = (int)(short)uVar131;
                auVar156._4_4_ = auVar82._0_4_ >> 0x10;
                auVar156._8_4_ = auVar216._8_4_ >> 0x10;
                auVar156._12_4_ = auVar154._12_4_ >> 0x10;
                uVar131 = *(ulong *)((long)pvVar138 + lVar148);
                auVar9._8_4_ = 0;
                auVar9._0_8_ = uVar131;
                auVar9._12_2_ = (short)(uVar131 >> 0x30);
                auVar32._8_2_ = (short)(uVar131 >> 0x20);
                auVar32._0_8_ = uVar131;
                auVar32._10_4_ = auVar9._10_4_;
                auVar83._6_8_ = 0;
                auVar83._0_6_ = auVar32._8_6_;
                auVar68._4_2_ = (short)(uVar131 >> 0x10);
                auVar68._0_4_ = (uint)uVar131;
                auVar68._6_8_ = SUB148(auVar83 << 0x40,6);
                auVar234._0_4_ = (uint)uVar131 & 0xffff;
                auVar234._4_10_ = auVar68._4_10_;
                auVar234._14_2_ = 0;
                auVar168 = pmaddwd(auVar234,auVar156);
                lVar2 = lVar148 * 2;
                iVar152 = *(int *)((long)&ptr + lVar2 + 4);
                iVar153 = *(int *)((long)&uStack_2f0 + lVar2);
                iVar123 = *(int *)((long)&uStack_2f0 + lVar2 + 4);
                uVar131 = *(ulong *)(lVar121 + lVar148);
                uVar165 = (undefined2)(uVar131 >> 0x30);
                auVar171._8_4_ = 0;
                auVar171._0_8_ = uVar131;
                auVar171._12_2_ = uVar165;
                auVar171._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar131 >> 0x20);
                auVar170._12_4_ = auVar171._12_4_;
                auVar170._8_2_ = 0;
                auVar170._0_8_ = uVar131;
                auVar170._10_2_ = uVar165;
                auVar169._10_6_ = auVar170._10_6_;
                auVar169._8_2_ = uVar165;
                auVar169._0_8_ = uVar131;
                uVar165 = (undefined2)(uVar131 >> 0x10);
                auVar84._4_8_ = auVar169._8_8_;
                auVar84._2_2_ = uVar165;
                auVar84._0_2_ = uVar165;
                auVar172._0_4_ = (int)(short)uVar131;
                auVar172._4_4_ = auVar84._0_4_ >> 0x10;
                auVar172._8_4_ = auVar169._8_4_ >> 0x10;
                auVar172._12_4_ = auVar170._12_4_ >> 0x10;
                uVar131 = *(ulong *)((long)pvVar138 + lVar148 + 0x20);
                auVar10._8_4_ = 0;
                auVar10._0_8_ = uVar131;
                auVar10._12_2_ = (short)(uVar131 >> 0x30);
                auVar33._8_2_ = (short)(uVar131 >> 0x20);
                auVar33._0_8_ = uVar131;
                auVar33._10_4_ = auVar10._10_4_;
                auVar85._6_8_ = 0;
                auVar85._0_6_ = auVar33._8_6_;
                auVar69._4_2_ = (short)(uVar131 >> 0x10);
                auVar69._0_4_ = (uint)uVar131;
                auVar69._6_8_ = SUB148(auVar85 << 0x40,6);
                auVar215._0_4_ = (uint)uVar131 & 0xffff;
                auVar215._4_10_ = auVar69._4_10_;
                auVar215._14_2_ = 0;
                auVar216 = pmaddwd(auVar215,auVar172);
                uVar131 = *(ulong *)(lVar118 + lVar148);
                uVar165 = (undefined2)(uVar131 >> 0x30);
                auVar201._8_4_ = 0;
                auVar201._0_8_ = uVar131;
                auVar201._12_2_ = uVar165;
                auVar201._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar131 >> 0x20);
                auVar200._12_4_ = auVar201._12_4_;
                auVar200._8_2_ = 0;
                auVar200._0_8_ = uVar131;
                auVar200._10_2_ = uVar165;
                auVar199._10_6_ = auVar200._10_6_;
                auVar199._8_2_ = uVar165;
                auVar199._0_8_ = uVar131;
                uVar165 = (undefined2)(uVar131 >> 0x10);
                auVar86._4_8_ = auVar199._8_8_;
                auVar86._2_2_ = uVar165;
                auVar86._0_2_ = uVar165;
                auVar202._0_4_ = (int)(short)uVar131;
                auVar202._4_4_ = auVar86._0_4_ >> 0x10;
                auVar202._8_4_ = auVar199._8_4_ >> 0x10;
                auVar202._12_4_ = auVar200._12_4_ >> 0x10;
                uVar131 = *(ulong *)((long)pvVar138 + lVar148 + 0x40);
                auVar11._8_4_ = 0;
                auVar11._0_8_ = uVar131;
                auVar11._12_2_ = (short)(uVar131 >> 0x30);
                auVar34._8_2_ = (short)(uVar131 >> 0x20);
                auVar34._0_8_ = uVar131;
                auVar34._10_4_ = auVar11._10_4_;
                auVar87._6_8_ = 0;
                auVar87._0_6_ = auVar34._8_6_;
                auVar251._6_8_ = SUB148(auVar87 << 0x40,6);
                auVar251._4_2_ = (short)(uVar131 >> 0x10);
                auVar251._0_2_ = (ushort)uVar131;
                auVar251._2_2_ = 0;
                auVar251._14_2_ = 0;
                auVar193 = pmaddwd(auVar251,auVar202);
                uVar131 = *(ulong *)(lVar128 + lVar148);
                uVar165 = (undefined2)(uVar131 >> 0x30);
                auVar219._8_4_ = 0;
                auVar219._0_8_ = uVar131;
                auVar219._12_2_ = uVar165;
                auVar219._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar131 >> 0x20);
                auVar218._12_4_ = auVar219._12_4_;
                auVar218._8_2_ = 0;
                auVar218._0_8_ = uVar131;
                auVar218._10_2_ = uVar165;
                auVar217._10_6_ = auVar218._10_6_;
                auVar217._8_2_ = uVar165;
                auVar217._0_8_ = uVar131;
                uVar165 = (undefined2)(uVar131 >> 0x10);
                auVar88._4_8_ = auVar217._8_8_;
                auVar88._2_2_ = uVar165;
                auVar88._0_2_ = uVar165;
                auVar220._0_4_ = (int)(short)uVar131;
                auVar220._4_4_ = auVar88._0_4_ >> 0x10;
                auVar220._8_4_ = auVar217._8_4_ >> 0x10;
                auVar220._12_4_ = auVar218._12_4_ >> 0x10;
                uVar131 = *(ulong *)((long)pvVar138 + lVar148 + 0x60);
                auVar12._8_4_ = 0;
                auVar12._0_8_ = uVar131;
                auVar12._12_2_ = (short)(uVar131 >> 0x30);
                auVar35._8_2_ = (short)(uVar131 >> 0x20);
                auVar35._0_8_ = uVar131;
                auVar35._10_4_ = auVar12._10_4_;
                auVar89._6_8_ = 0;
                auVar89._0_6_ = auVar35._8_6_;
                auVar259._6_8_ = SUB148(auVar89 << 0x40,6);
                auVar259._4_2_ = (short)(uVar131 >> 0x10);
                auVar259._0_2_ = (ushort)uVar131;
                auVar259._2_2_ = 0;
                auVar259._14_2_ = 0;
                auVar214 = pmaddwd(auVar259,auVar220);
                lVar3 = lVar148 * 2;
                *(int *)((long)&ptr + lVar3) =
                     auVar214._0_4_ + auVar193._0_4_ + auVar216._0_4_ +
                     auVar168._0_4_ + *(int *)((long)&ptr + lVar2);
                *(int *)((long)&ptr + lVar3 + 4) =
                     auVar214._4_4_ + auVar193._4_4_ + auVar216._4_4_ + auVar168._4_4_ + iVar152;
                *(int *)((long)&uStack_2f0 + lVar3) =
                     auVar214._8_4_ + auVar193._8_4_ + auVar216._8_4_ + auVar168._8_4_ + iVar153;
                *(int *)((long)&uStack_2f0 + lVar3 + 4) =
                     auVar214._12_4_ + auVar193._12_4_ + auVar216._12_4_ + auVar168._12_4_ + iVar123
                ;
                lVar2 = lVar137 + lVar148;
                uVar131 = *(ulong *)((long)pvVar138 + lVar137 + lVar148);
                auVar13._8_4_ = 0;
                auVar13._0_8_ = uVar131;
                auVar13._12_2_ = (short)(uVar131 >> 0x30);
                auVar36._8_2_ = (short)(uVar131 >> 0x20);
                auVar36._0_8_ = uVar131;
                auVar36._10_4_ = auVar13._10_4_;
                auVar90._6_8_ = 0;
                auVar90._0_6_ = auVar36._8_6_;
                auVar235._6_8_ = SUB148(auVar90 << 0x40,6);
                auVar235._4_2_ = (short)(uVar131 >> 0x10);
                auVar235._0_2_ = (ushort)uVar131;
                auVar235._2_2_ = 0;
                auVar235._14_2_ = 0;
                auVar216 = pmaddwd(auVar235,auVar156);
                iVar152 = *(int *)(local_148 + lVar148 * 2 + -8);
                iVar153 = *(int *)(local_148 + lVar148 * 2 + -4);
                uVar131 = *(ulong *)((long)pvVar138 + lVar137 + 0x20 + lVar148);
                auVar14._8_4_ = 0;
                auVar14._0_8_ = uVar131;
                auVar14._12_2_ = (short)(uVar131 >> 0x30);
                auVar37._8_2_ = (short)(uVar131 >> 0x20);
                auVar37._0_8_ = uVar131;
                auVar37._10_4_ = auVar14._10_4_;
                auVar91._6_8_ = 0;
                auVar91._0_6_ = auVar37._8_6_;
                auVar252._6_8_ = SUB148(auVar91 << 0x40,6);
                auVar252._4_2_ = (short)(uVar131 >> 0x10);
                auVar252._0_2_ = (ushort)uVar131;
                auVar252._2_2_ = 0;
                auVar252._14_2_ = 0;
                auVar168 = pmaddwd(auVar252,auVar172);
                uVar131 = *(ulong *)((long)pvVar138 + lVar137 + 0x40 + lVar148);
                auVar15._8_4_ = 0;
                auVar15._0_8_ = uVar131;
                auVar15._12_2_ = (short)(uVar131 >> 0x30);
                auVar38._8_2_ = (short)(uVar131 >> 0x20);
                auVar38._0_8_ = uVar131;
                auVar38._10_4_ = auVar15._10_4_;
                auVar92._6_8_ = 0;
                auVar92._0_6_ = auVar38._8_6_;
                auVar260._6_8_ = SUB148(auVar92 << 0x40,6);
                auVar260._4_2_ = (short)(uVar131 >> 0x10);
                auVar260._0_2_ = (ushort)uVar131;
                auVar260._2_2_ = 0;
                auVar260._14_2_ = 0;
                auVar214 = pmaddwd(auVar260,auVar202);
                uVar131 = *(ulong *)((long)pvVar138 + lVar137 + 0x60 + lVar148);
                auVar16._8_4_ = 0;
                auVar16._0_8_ = uVar131;
                auVar16._12_2_ = (short)(uVar131 >> 0x30);
                auVar39._8_2_ = (short)(uVar131 >> 0x20);
                auVar39._0_8_ = uVar131;
                auVar39._10_4_ = auVar16._10_4_;
                auVar93._6_8_ = 0;
                auVar93._0_6_ = auVar39._8_6_;
                auVar253._6_8_ = SUB148(auVar93 << 0x40,6);
                auVar253._4_2_ = (short)(uVar131 >> 0x10);
                auVar253._0_2_ = (ushort)uVar131;
                auVar253._2_2_ = 0;
                auVar253._14_2_ = 0;
                auVar193 = pmaddwd(auVar253,auVar220);
                *(int *)(d1 + lVar148) =
                     auVar193._0_4_ + auVar214._0_4_ + auVar168._0_4_ +
                     auVar216._0_4_ + *(int *)(d1 + lVar148);
                *(int *)(d1 + lVar148 + 2) =
                     auVar193._4_4_ + auVar214._4_4_ + auVar168._4_4_ +
                     auVar216._4_4_ + *(int *)(d1 + lVar148 + 2);
                *(int *)(local_148 + lVar148 * 2 + -8) =
                     auVar193._8_4_ + auVar214._8_4_ + auVar168._8_4_ + auVar216._8_4_ + iVar152;
                *(int *)(local_148 + lVar148 * 2 + -4) =
                     auVar193._12_4_ + auVar214._12_4_ + auVar168._12_4_ + auVar216._12_4_ + iVar153
                ;
                lVar3 = lVar137 + lVar2;
                uVar131 = *(ulong *)((long)pvVar138 + lVar137 + lVar2);
                auVar17._8_4_ = 0;
                auVar17._0_8_ = uVar131;
                auVar17._12_2_ = (short)(uVar131 >> 0x30);
                auVar40._8_2_ = (short)(uVar131 >> 0x20);
                auVar40._0_8_ = uVar131;
                auVar40._10_4_ = auVar17._10_4_;
                auVar94._6_8_ = 0;
                auVar94._0_6_ = auVar40._8_6_;
                auVar236._6_8_ = SUB148(auVar94 << 0x40,6);
                auVar236._4_2_ = (short)(uVar131 >> 0x10);
                auVar236._0_2_ = (ushort)uVar131;
                auVar236._2_2_ = 0;
                auVar236._14_2_ = 0;
                auVar216 = pmaddwd(auVar236,auVar156);
                iVar152 = *(int *)((long)aiStack_e0 + lVar148 * 2);
                iVar153 = *(int *)(local_d8 + lVar148 * 2 + -4);
                uVar131 = *(ulong *)((long)pvVar138 + lVar137 + 0x20 + lVar2);
                auVar18._8_4_ = 0;
                auVar18._0_8_ = uVar131;
                auVar18._12_2_ = (short)(uVar131 >> 0x30);
                auVar41._8_2_ = (short)(uVar131 >> 0x20);
                auVar41._0_8_ = uVar131;
                auVar41._10_4_ = auVar18._10_4_;
                auVar95._6_8_ = 0;
                auVar95._0_6_ = auVar41._8_6_;
                auVar254._6_8_ = SUB148(auVar95 << 0x40,6);
                auVar254._4_2_ = (short)(uVar131 >> 0x10);
                auVar254._0_2_ = (ushort)uVar131;
                auVar254._2_2_ = 0;
                auVar254._14_2_ = 0;
                auVar168 = pmaddwd(auVar254,auVar172);
                uVar131 = *(ulong *)((long)pvVar138 + lVar137 + 0x40 + lVar2);
                auVar19._8_4_ = 0;
                auVar19._0_8_ = uVar131;
                auVar19._12_2_ = (short)(uVar131 >> 0x30);
                auVar42._8_2_ = (short)(uVar131 >> 0x20);
                auVar42._0_8_ = uVar131;
                auVar42._10_4_ = auVar19._10_4_;
                auVar96._6_8_ = 0;
                auVar96._0_6_ = auVar42._8_6_;
                auVar261._6_8_ = SUB148(auVar96 << 0x40,6);
                auVar261._4_2_ = (short)(uVar131 >> 0x10);
                auVar261._0_2_ = (ushort)uVar131;
                auVar261._2_2_ = 0;
                auVar261._14_2_ = 0;
                auVar214 = pmaddwd(auVar261,auVar202);
                uVar131 = *(ulong *)((long)pvVar138 + lVar137 + 0x60 + lVar2);
                auVar20._8_4_ = 0;
                auVar20._0_8_ = uVar131;
                auVar20._12_2_ = (short)(uVar131 >> 0x30);
                auVar43._8_2_ = (short)(uVar131 >> 0x20);
                auVar43._0_8_ = uVar131;
                auVar43._10_4_ = auVar20._10_4_;
                auVar97._6_8_ = 0;
                auVar97._0_6_ = auVar43._8_6_;
                auVar255._6_8_ = SUB148(auVar97 << 0x40,6);
                auVar255._4_2_ = (short)(uVar131 >> 0x10);
                auVar255._0_2_ = (ushort)uVar131;
                auVar255._2_2_ = 0;
                auVar255._14_2_ = 0;
                auVar193 = pmaddwd(auVar255,auVar220);
                *(int *)(d2 + lVar148) =
                     auVar193._0_4_ + auVar214._0_4_ + auVar168._0_4_ +
                     auVar216._0_4_ + *(int *)(d2 + lVar148);
                *(int *)(d2 + lVar148 + 2) =
                     auVar193._4_4_ + auVar214._4_4_ + auVar168._4_4_ +
                     auVar216._4_4_ + *(int *)(d2 + lVar148 + 2);
                *(int *)((long)aiStack_e0 + lVar148 * 2) =
                     auVar193._8_4_ + auVar214._8_4_ + auVar168._8_4_ + auVar216._8_4_ + iVar152;
                *(int *)(local_d8 + lVar148 * 2 + -4) =
                     auVar193._12_4_ + auVar214._12_4_ + auVar168._12_4_ + auVar216._12_4_ + iVar153
                ;
                uVar131 = *(ulong *)((long)pvVar138 + lVar137 + lVar3);
                auVar21._8_4_ = 0;
                auVar21._0_8_ = uVar131;
                auVar21._12_2_ = (short)(uVar131 >> 0x30);
                auVar44._8_2_ = (short)(uVar131 >> 0x20);
                auVar44._0_8_ = uVar131;
                auVar44._10_4_ = auVar21._10_4_;
                auVar98._6_8_ = 0;
                auVar98._0_6_ = auVar44._8_6_;
                auVar237._6_8_ = SUB148(auVar98 << 0x40,6);
                auVar237._4_2_ = (short)(uVar131 >> 0x10);
                auVar237._0_2_ = (ushort)uVar131;
                auVar237._2_2_ = 0;
                auVar237._14_2_ = 0;
                auVar214 = pmaddwd(auVar237,auVar156);
                iVar152 = *(int *)((long)aiStack_a0 + lVar148 * 2);
                iVar153 = *(int *)(local_98 + lVar148 * 2 + -4);
                uVar131 = *(ulong *)((long)pvVar138 + lVar137 + 0x20 + lVar3);
                auVar22._8_4_ = 0;
                auVar22._0_8_ = uVar131;
                auVar22._12_2_ = (short)(uVar131 >> 0x30);
                auVar45._8_2_ = (short)(uVar131 >> 0x20);
                auVar45._0_8_ = uVar131;
                auVar45._10_4_ = auVar22._10_4_;
                auVar99._6_8_ = 0;
                auVar99._0_6_ = auVar45._8_6_;
                auVar157._6_8_ = SUB148(auVar99 << 0x40,6);
                auVar157._4_2_ = (short)(uVar131 >> 0x10);
                auVar157._0_2_ = (ushort)uVar131;
                auVar157._2_2_ = 0;
                auVar157._14_2_ = 0;
                auVar216 = pmaddwd(auVar157,auVar172);
                uVar131 = *(ulong *)((long)pvVar138 + lVar137 + 0x40 + lVar3);
                auVar23._8_4_ = 0;
                auVar23._0_8_ = uVar131;
                auVar23._12_2_ = (short)(uVar131 >> 0x30);
                auVar46._8_2_ = (short)(uVar131 >> 0x20);
                auVar46._0_8_ = uVar131;
                auVar46._10_4_ = auVar23._10_4_;
                auVar100._6_8_ = 0;
                auVar100._0_6_ = auVar46._8_6_;
                auVar173._6_8_ = SUB148(auVar100 << 0x40,6);
                auVar173._4_2_ = (short)(uVar131 >> 0x10);
                auVar173._0_2_ = (ushort)uVar131;
                auVar173._2_2_ = 0;
                auVar173._14_2_ = 0;
                auVar193 = pmaddwd(auVar173,auVar202);
                uVar131 = *(ulong *)((long)pvVar138 + lVar137 + 0x60 + lVar3);
                auVar24._8_4_ = 0;
                auVar24._0_8_ = uVar131;
                auVar24._12_2_ = (short)(uVar131 >> 0x30);
                auVar47._8_2_ = (short)(uVar131 >> 0x20);
                auVar47._0_8_ = uVar131;
                auVar47._10_4_ = auVar24._10_4_;
                auVar101._6_8_ = 0;
                auVar101._0_6_ = auVar47._8_6_;
                auVar158._6_8_ = SUB148(auVar101 << 0x40,6);
                auVar158._4_2_ = (short)(uVar131 >> 0x10);
                auVar158._0_2_ = (ushort)uVar131;
                auVar158._2_2_ = 0;
                auVar158._14_2_ = 0;
                auVar168 = pmaddwd(auVar158,auVar220);
                *(int *)(d3 + lVar148) =
                     auVar168._0_4_ + auVar193._0_4_ + auVar216._0_4_ +
                     auVar214._0_4_ + *(int *)(d3 + lVar148);
                *(int *)(d3 + lVar148 + 2) =
                     auVar168._4_4_ + auVar193._4_4_ + auVar216._4_4_ +
                     auVar214._4_4_ + *(int *)(d3 + lVar148 + 2);
                *(int *)((long)aiStack_a0 + lVar148 * 2) =
                     auVar168._8_4_ + auVar193._8_4_ + auVar216._8_4_ + auVar214._8_4_ + iVar152;
                *(int *)(local_98 + lVar148 * 2 + -4) =
                     auVar168._12_4_ + auVar193._12_4_ + auVar216._12_4_ + auVar214._12_4_ + iVar153
                ;
                lVar148 = lVar148 + 8;
              } while (lVar148 != 0x20);
              uVar131 = uVar151 + 4;
              lVar148 = uVar151 + 7;
              lVar119 = lVar119 + lVar146;
              pvVar138 = (void *)((long)pvVar138 + (long)local_2a0);
              lVar121 = lVar121 + lVar146;
              lVar118 = lVar118 + lVar146;
              lVar128 = lVar128 + lVar146;
              uVar151 = uVar131;
            } while (lVar148 < lVar134);
          }
          if ((int)uVar131 < (int)uVar4) {
            uVar131 = uVar131 & 0xffffffff;
            lVar121 = (long)local_330 + local_1c8 * uVar131 + uVar147;
            lVar119 = lVar135 * uVar131;
            pvVar138 = (void *)(lVar119 + (long)pvVar140);
            pvVar132 = (void *)((long)local_280 + lVar119);
            pvVar139 = (void *)((long)local_228 + lVar119);
            pvVar120 = (void *)(lVar119 + (long)local_278);
            do {
              lVar119 = 0;
              do {
                uVar147 = *(ulong *)(lVar121 + lVar119);
                uVar165 = (undefined2)(uVar147 >> 0x30);
                auVar161._8_4_ = 0;
                auVar161._0_8_ = uVar147;
                auVar161._12_2_ = uVar165;
                auVar161._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar147 >> 0x20);
                auVar160._12_4_ = auVar161._12_4_;
                auVar160._8_2_ = 0;
                auVar160._0_8_ = uVar147;
                auVar160._10_2_ = uVar165;
                auVar159._10_6_ = auVar160._10_6_;
                auVar159._8_2_ = uVar165;
                auVar159._0_8_ = uVar147;
                uVar165 = (undefined2)(uVar147 >> 0x10);
                auVar102._4_8_ = auVar159._8_8_;
                auVar102._2_2_ = uVar165;
                auVar102._0_2_ = uVar165;
                auVar162._0_4_ = (int)(short)uVar147;
                auVar162._4_4_ = auVar102._0_4_ >> 0x10;
                auVar162._8_4_ = auVar159._8_4_ >> 0x10;
                auVar162._12_4_ = auVar160._12_4_ >> 0x10;
                uVar147 = *(ulong *)((long)pvVar138 + lVar119);
                auVar25._8_4_ = 0;
                auVar25._0_8_ = uVar147;
                auVar25._12_2_ = (short)(uVar147 >> 0x30);
                auVar48._8_2_ = (short)(uVar147 >> 0x20);
                auVar48._0_8_ = uVar147;
                auVar48._10_4_ = auVar25._10_4_;
                auVar103._6_8_ = 0;
                auVar103._0_6_ = auVar48._8_6_;
                auVar174._6_8_ = SUB148(auVar103 << 0x40,6);
                auVar174._4_2_ = (short)(uVar147 >> 0x10);
                auVar174._0_2_ = (ushort)uVar147;
                auVar174._2_2_ = 0;
                auVar174._14_2_ = 0;
                auVar216 = pmaddwd(auVar174,auVar162);
                lVar128 = lVar119 * 2;
                iVar152 = *(int *)((long)&ptr + lVar128 + 4);
                iVar153 = *(int *)((long)&uStack_2f0 + lVar128);
                iVar123 = *(int *)((long)&uStack_2f0 + lVar128 + 4);
                lVar118 = lVar119 * 2;
                *(int *)((long)&ptr + lVar118) = auVar216._0_4_ + *(int *)((long)&ptr + lVar128);
                *(int *)((long)&ptr + lVar118 + 4) = auVar216._4_4_ + iVar152;
                *(int *)((long)&uStack_2f0 + lVar118) = auVar216._8_4_ + iVar153;
                *(int *)((long)&uStack_2f0 + lVar118 + 4) = auVar216._12_4_ + iVar123;
                uVar147 = *(ulong *)((long)pvVar132 + lVar119);
                auVar26._8_4_ = 0;
                auVar26._0_8_ = uVar147;
                auVar26._12_2_ = (short)(uVar147 >> 0x30);
                auVar49._8_2_ = (short)(uVar147 >> 0x20);
                auVar49._0_8_ = uVar147;
                auVar49._10_4_ = auVar26._10_4_;
                auVar104._6_8_ = 0;
                auVar104._0_6_ = auVar49._8_6_;
                auVar175._6_8_ = SUB148(auVar104 << 0x40,6);
                auVar175._4_2_ = (short)(uVar147 >> 0x10);
                auVar175._0_2_ = (ushort)uVar147;
                auVar175._2_2_ = 0;
                auVar175._14_2_ = 0;
                auVar216 = pmaddwd(auVar175,auVar162);
                iVar152 = *(int *)(local_148 + lVar119 * 2 + -8);
                iVar153 = *(int *)(local_148 + lVar119 * 2 + -4);
                *(int *)(d1 + lVar119) = auVar216._0_4_ + *(int *)(d1 + lVar119);
                *(int *)(d1 + lVar119 + 2) = auVar216._4_4_ + *(int *)(d1 + lVar119 + 2);
                *(int *)(local_148 + lVar119 * 2 + -8) = auVar216._8_4_ + iVar152;
                *(int *)(local_148 + lVar119 * 2 + -4) = auVar216._12_4_ + iVar153;
                uVar147 = *(ulong *)((long)pvVar139 + lVar119);
                auVar27._8_4_ = 0;
                auVar27._0_8_ = uVar147;
                auVar27._12_2_ = (short)(uVar147 >> 0x30);
                auVar50._8_2_ = (short)(uVar147 >> 0x20);
                auVar50._0_8_ = uVar147;
                auVar50._10_4_ = auVar27._10_4_;
                auVar105._6_8_ = 0;
                auVar105._0_6_ = auVar50._8_6_;
                auVar176._6_8_ = SUB148(auVar105 << 0x40,6);
                auVar176._4_2_ = (short)(uVar147 >> 0x10);
                auVar176._0_2_ = (ushort)uVar147;
                auVar176._2_2_ = 0;
                auVar176._14_2_ = 0;
                auVar216 = pmaddwd(auVar176,auVar162);
                iVar152 = *(int *)((long)aiStack_e0 + lVar119 * 2);
                iVar153 = *(int *)(local_d8 + lVar119 * 2 + -4);
                *(int *)(d2 + lVar119) = auVar216._0_4_ + *(int *)(d2 + lVar119);
                *(int *)(d2 + lVar119 + 2) = auVar216._4_4_ + *(int *)(d2 + lVar119 + 2);
                *(int *)((long)aiStack_e0 + lVar119 * 2) = auVar216._8_4_ + iVar152;
                *(int *)(local_d8 + lVar119 * 2 + -4) = auVar216._12_4_ + iVar153;
                uVar147 = *(ulong *)((long)pvVar120 + lVar119);
                auVar28._8_4_ = 0;
                auVar28._0_8_ = uVar147;
                auVar28._12_2_ = (short)(uVar147 >> 0x30);
                auVar51._8_2_ = (short)(uVar147 >> 0x20);
                auVar51._0_8_ = uVar147;
                auVar51._10_4_ = auVar28._10_4_;
                auVar106._6_8_ = 0;
                auVar106._0_6_ = auVar51._8_6_;
                auVar177._6_8_ = SUB148(auVar106 << 0x40,6);
                auVar177._4_2_ = (short)(uVar147 >> 0x10);
                auVar177._0_2_ = (ushort)uVar147;
                auVar177._2_2_ = 0;
                auVar177._14_2_ = 0;
                auVar216 = pmaddwd(auVar177,auVar162);
                iVar152 = *(int *)((long)aiStack_a0 + lVar119 * 2);
                iVar153 = *(int *)(local_98 + lVar119 * 2 + -4);
                *(int *)(d3 + lVar119) = auVar216._0_4_ + *(int *)(d3 + lVar119);
                *(int *)(d3 + lVar119 + 2) = auVar216._4_4_ + *(int *)(d3 + lVar119 + 2);
                *(int *)((long)aiStack_a0 + lVar119 * 2) = auVar216._8_4_ + iVar152;
                *(int *)(local_98 + lVar119 * 2 + -4) = auVar216._12_4_ + iVar153;
                lVar119 = lVar119 + 8;
              } while (lVar119 != 0x20);
              uVar131 = uVar131 + 1;
              lVar121 = lVar121 + local_1c8;
              pvVar138 = (void *)((long)pvVar138 + lVar135);
              pvVar132 = (void *)((long)pvVar132 + lVar135);
              pvVar139 = (void *)((long)pvVar139 + lVar135);
              pvVar120 = (void *)((long)pvVar120 + lVar135);
            } while (uVar131 != uVar4);
          }
          lVar119 = 0;
          do {
            *(undefined4 *)((long)pvVar122 + lVar119) = *(undefined4 *)((long)&ptr + lVar119);
            *(undefined4 *)((long)pvVar129 + lVar119) = *(undefined4 *)((long)d1 + lVar119);
            *(undefined4 *)((long)pvVar124 + lVar119) = *(undefined4 *)((long)d2 + lVar119);
            *(undefined4 *)((long)pvVar136 + lVar119) = *(undefined4 *)((long)d3 + lVar119);
            lVar119 = lVar119 + 4;
          } while (lVar119 != 0x40);
          pvVar136 = (void *)((long)pvVar136 + 0x40);
          pvVar124 = (void *)((long)pvVar124 + 0x40);
          pvVar129 = (void *)((long)pvVar129 + 0x40);
          pvVar122 = (void *)((long)pvVar122 + 0x40);
          pvVar138 = (void *)((long)local_2a8 + 1U);
          local_1c0 = pvVar140;
        } while ((void *)((long)local_2a8 + 1U) != local_220);
      }
      pvVar140 = (void *)((long)pvVar140 + local_208);
      local_280 = (void *)((long)local_280 + local_208);
      local_228 = (void *)((long)local_228 + local_208);
      local_278 = (void *)((long)local_278 + local_208);
      local_288 = (void *)((long)local_288 + local_f8);
      local_230 = (void *)((long)local_230 + local_f8);
      local_238 = (void *)((long)local_238 + local_f8);
      local_240 = (void *)((long)local_240 + local_f8);
      pvVar122 = (void *)((long)local_1e8 + 1U);
    } while ((void *)((long)local_1e8 + 1U) != local_200);
  }
  if ((int)local_1f8 != (int)local_268) {
    local_300 = local_248->data;
    sVar5 = local_248->elemsize;
    local_1c8 = local_290 * 2;
    local_1d0 = (void *)(ulong)uVar4;
    lVar146 = local_290 * 8;
    local_230 = (void *)(local_248->cstep * sVar5);
    local_318 = (void *)((long)local_230 * local_1f8 + (long)local_300);
    local_240 = (void *)(sVar5 * 4);
    local_1d8 = (void *)((long)local_330 + local_290 * 2);
    local_238 = (void *)(local_290 * 4);
    local_1e0 = (void *)((long)local_330 + local_290 * 4);
    local_200 = (void *)(sVar5 * 2);
    local_1e8 = (void *)((long)local_330 + local_290 * 6);
    local_1c0 = (void *)(local_248->cstep * local_1f8);
    local_288 = (void *)((long)local_328 + local_290 * local_1f8 * 4);
    local_208 = sVar5 * 3;
    uVar131 = local_1f8;
    do {
      local_1f8 = uVar131;
      if (0 < (int)local_294) {
        local_2a8 = (void *)(long)local_248->w;
        lVar137 = (long)local_240 * (long)local_2a8;
        local_278 = (void *)((long)local_318 + sVar5 * (long)local_2a8);
        local_280 = (void *)((long)local_200 * (long)local_2a8 + (long)local_318);
        local_228 = (void *)(local_208 * (long)local_2a8 + (long)local_318);
        pvVar122 = (void *)0x0;
        pvVar140 = local_288;
        do {
          uVar147 = (ulong)(uint)((int)pvVar122 << 5);
          uVar131 = 0;
          local_2c8 = (undefined1  [16])0x0;
          local_2d8 = (undefined1  [16])0x0;
          pvStack_2e8 = (void *)0x0;
          iStack_2e0 = 0;
          uStack_2dc = 0;
          ptr = (void *)0x0;
          uStack_2f0._0_4_ = 0;
          uStack_2f0._4_4_ = 0;
          if (3 < (int)uVar4) {
            lVar135 = (long)local_330 + uVar147;
            lVar119 = (long)local_1d8 + uVar147;
            lVar128 = (long)local_1e0 + uVar147;
            lVar121 = (long)local_1e8 + uVar147;
            pvVar124 = local_318;
            uVar151 = 0;
            pvVar129 = local_278;
            pvVar136 = local_228;
            pvVar138 = local_280;
            do {
              lVar118 = 0;
              do {
                uVar131 = *(ulong *)(lVar135 + lVar118);
                uVar130 = *(ulong *)((long)pvVar124 + lVar118);
                uVar165 = (undefined2)(uVar130 >> 0x30);
                auVar181._8_4_ = 0;
                auVar181._0_8_ = uVar130;
                auVar181._12_2_ = uVar165;
                auVar181._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar130 >> 0x20);
                auVar180._12_4_ = auVar181._12_4_;
                auVar180._8_2_ = 0;
                auVar180._0_8_ = uVar130;
                auVar180._10_2_ = uVar165;
                auVar179._10_6_ = auVar180._10_6_;
                auVar179._8_2_ = uVar165;
                auVar179._0_8_ = uVar130;
                uVar165 = (undefined2)(uVar130 >> 0x10);
                auVar178._8_8_ = auVar179._8_8_;
                auVar178._6_2_ = uVar165;
                auVar178._4_2_ = uVar165;
                auVar178._0_2_ = (undefined2)uVar130;
                auVar178._2_2_ = auVar178._0_2_;
                auVar52._8_4_ = 0;
                auVar52._0_8_ = uVar131;
                auVar52._12_2_ = (short)(uVar131 >> 0x30);
                auVar60._8_2_ = (short)(uVar131 >> 0x20);
                auVar60._0_8_ = uVar131;
                auVar60._10_4_ = auVar52._10_4_;
                auVar107._6_8_ = 0;
                auVar107._0_6_ = auVar60._8_6_;
                auVar73._4_2_ = (short)(uVar131 >> 0x10);
                auVar73._0_4_ = (uint)uVar131;
                auVar73._6_8_ = SUB148(auVar107 << 0x40,6);
                auVar163._0_4_ = (uint)uVar131 & 0xffff;
                auVar163._4_10_ = auVar73._4_10_;
                auVar163._14_2_ = 0;
                auVar216 = pmaddwd(auVar163,auVar178);
                lVar148 = lVar118 * 2;
                iVar152 = *(int *)((long)&ptr + lVar148 + 4);
                iVar153 = *(int *)((long)&uStack_2f0 + lVar148);
                iVar123 = *(int *)((long)&uStack_2f0 + lVar148 + 4);
                uVar131 = *(ulong *)(lVar119 + lVar118);
                uVar130 = *(ulong *)((long)pvVar129 + lVar118);
                uVar165 = (undefined2)(uVar130 >> 0x30);
                auVar206._8_4_ = 0;
                auVar206._0_8_ = uVar130;
                auVar206._12_2_ = uVar165;
                auVar206._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar130 >> 0x20);
                auVar205._12_4_ = auVar206._12_4_;
                auVar205._8_2_ = 0;
                auVar205._0_8_ = uVar130;
                auVar205._10_2_ = uVar165;
                auVar204._10_6_ = auVar205._10_6_;
                auVar204._8_2_ = uVar165;
                auVar204._0_8_ = uVar130;
                uVar165 = (undefined2)(uVar130 >> 0x10);
                auVar203._8_8_ = auVar204._8_8_;
                auVar203._6_2_ = uVar165;
                auVar203._4_2_ = uVar165;
                auVar203._0_2_ = (undefined2)uVar130;
                auVar203._2_2_ = auVar203._0_2_;
                auVar53._8_4_ = 0;
                auVar53._0_8_ = uVar131;
                auVar53._12_2_ = (short)(uVar131 >> 0x30);
                auVar61._8_2_ = (short)(uVar131 >> 0x20);
                auVar61._0_8_ = uVar131;
                auVar61._10_4_ = auVar53._10_4_;
                auVar108._6_8_ = 0;
                auVar108._0_6_ = auVar61._8_6_;
                auVar74._4_2_ = (short)(uVar131 >> 0x10);
                auVar74._0_4_ = (uint)uVar131;
                auVar74._6_8_ = SUB148(auVar108 << 0x40,6);
                auVar182._0_4_ = (uint)uVar131 & 0xffff;
                auVar182._4_10_ = auVar74._4_10_;
                auVar182._14_2_ = 0;
                auVar168 = pmaddwd(auVar182,auVar203);
                uVar131 = *(ulong *)(lVar128 + lVar118);
                uVar130 = *(ulong *)((long)pvVar138 + lVar118);
                uVar165 = (undefined2)(uVar130 >> 0x30);
                auVar224._8_4_ = 0;
                auVar224._0_8_ = uVar130;
                auVar224._12_2_ = uVar165;
                auVar224._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar130 >> 0x20);
                auVar223._12_4_ = auVar224._12_4_;
                auVar223._8_2_ = 0;
                auVar223._0_8_ = uVar130;
                auVar223._10_2_ = uVar165;
                auVar222._10_6_ = auVar223._10_6_;
                auVar222._8_2_ = uVar165;
                auVar222._0_8_ = uVar130;
                uVar165 = (undefined2)(uVar130 >> 0x10);
                auVar221._8_8_ = auVar222._8_8_;
                auVar221._6_2_ = uVar165;
                auVar221._4_2_ = uVar165;
                auVar221._0_2_ = (undefined2)uVar130;
                auVar221._2_2_ = auVar221._0_2_;
                auVar54._8_4_ = 0;
                auVar54._0_8_ = uVar131;
                auVar54._12_2_ = (short)(uVar131 >> 0x30);
                auVar62._8_2_ = (short)(uVar131 >> 0x20);
                auVar62._0_8_ = uVar131;
                auVar62._10_4_ = auVar54._10_4_;
                auVar109._6_8_ = 0;
                auVar109._0_6_ = auVar62._8_6_;
                auVar207._6_8_ = SUB148(auVar109 << 0x40,6);
                auVar207._4_2_ = (short)(uVar131 >> 0x10);
                auVar207._0_2_ = (ushort)uVar131;
                auVar207._2_2_ = 0;
                auVar207._14_2_ = 0;
                auVar214 = pmaddwd(auVar207,auVar221);
                uVar131 = *(ulong *)(lVar121 + lVar118);
                uVar130 = *(ulong *)((long)pvVar136 + lVar118);
                uVar165 = (undefined2)(uVar130 >> 0x30);
                auVar228._8_4_ = 0;
                auVar228._0_8_ = uVar130;
                auVar228._12_2_ = uVar165;
                auVar228._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar130 >> 0x20);
                auVar227._12_4_ = auVar228._12_4_;
                auVar227._8_2_ = 0;
                auVar227._0_8_ = uVar130;
                auVar227._10_2_ = uVar165;
                auVar226._10_6_ = auVar227._10_6_;
                auVar226._8_2_ = uVar165;
                auVar226._0_8_ = uVar130;
                uVar165 = (undefined2)(uVar130 >> 0x10);
                auVar225._8_8_ = auVar226._8_8_;
                auVar225._6_2_ = uVar165;
                auVar225._4_2_ = uVar165;
                auVar225._0_2_ = (undefined2)uVar130;
                auVar225._2_2_ = auVar225._0_2_;
                auVar55._8_4_ = 0;
                auVar55._0_8_ = uVar131;
                auVar55._12_2_ = (short)(uVar131 >> 0x30);
                auVar63._8_2_ = (short)(uVar131 >> 0x20);
                auVar63._0_8_ = uVar131;
                auVar63._10_4_ = auVar55._10_4_;
                auVar110._6_8_ = 0;
                auVar110._0_6_ = auVar63._8_6_;
                auVar183._6_8_ = SUB148(auVar110 << 0x40,6);
                auVar183._4_2_ = (short)(uVar131 >> 0x10);
                auVar183._0_2_ = (ushort)uVar131;
                auVar183._2_2_ = 0;
                auVar183._14_2_ = 0;
                auVar193 = pmaddwd(auVar183,auVar225);
                lVar2 = lVar118 * 2;
                *(int *)((long)&ptr + lVar2) =
                     auVar193._0_4_ + auVar214._0_4_ + auVar168._0_4_ +
                     auVar216._0_4_ + *(int *)((long)&ptr + lVar148);
                *(int *)((long)&ptr + lVar2 + 4) =
                     auVar193._4_4_ + auVar214._4_4_ + auVar168._4_4_ + auVar216._4_4_ + iVar152;
                *(int *)((long)&uStack_2f0 + lVar2) =
                     auVar193._8_4_ + auVar214._8_4_ + auVar168._8_4_ + auVar216._8_4_ + iVar153;
                *(int *)((long)&uStack_2f0 + lVar2 + 4) =
                     auVar193._12_4_ + auVar214._12_4_ + auVar168._12_4_ + auVar216._12_4_ + iVar123
                ;
                lVar118 = lVar118 + 8;
              } while (lVar118 != 0x20);
              uVar131 = uVar151 + 4;
              lVar118 = uVar151 + 7;
              lVar135 = lVar135 + lVar146;
              pvVar124 = (void *)((long)pvVar124 + lVar137);
              lVar119 = lVar119 + lVar146;
              pvVar129 = (void *)((long)pvVar129 + lVar137);
              lVar128 = lVar128 + lVar146;
              pvVar138 = (void *)((long)pvVar138 + lVar137);
              lVar121 = lVar121 + lVar146;
              pvVar136 = (void *)((long)pvVar136 + lVar137);
              uVar151 = uVar131;
              local_2a0 = pvVar122;
            } while (lVar118 < lVar134);
          }
          if ((int)uVar131 < (int)uVar4) {
            pvVar124 = (void *)(uVar131 & 0xffffffff);
            lVar135 = (long)local_330 + local_1c8 * (long)pvVar124 + uVar147;
            pvVar129 = (void *)((long)((long)local_2a8 * (long)pvVar124 + (long)local_1c0) * sVar5 +
                               (long)local_300);
            do {
              lVar119 = 0;
              do {
                uVar131 = *(ulong *)(lVar135 + lVar119 * 2);
                uVar147 = *(ulong *)((long)pvVar129 + lVar119 * 2);
                uVar165 = (undefined2)(uVar147 >> 0x30);
                auVar187._8_4_ = 0;
                auVar187._0_8_ = uVar147;
                auVar187._12_2_ = uVar165;
                auVar187._14_2_ = uVar165;
                uVar165 = (undefined2)(uVar147 >> 0x20);
                auVar186._12_4_ = auVar187._12_4_;
                auVar186._8_2_ = 0;
                auVar186._0_8_ = uVar147;
                auVar186._10_2_ = uVar165;
                auVar185._10_6_ = auVar186._10_6_;
                auVar185._8_2_ = uVar165;
                auVar185._0_8_ = uVar147;
                uVar165 = (undefined2)(uVar147 >> 0x10);
                auVar184._8_8_ = auVar185._8_8_;
                auVar184._6_2_ = uVar165;
                auVar184._4_2_ = uVar165;
                auVar184._0_2_ = (undefined2)uVar147;
                auVar184._2_2_ = auVar184._0_2_;
                auVar56._8_4_ = 0;
                auVar56._0_8_ = uVar131;
                auVar56._12_2_ = (short)(uVar131 >> 0x30);
                auVar64._8_2_ = (short)(uVar131 >> 0x20);
                auVar64._0_8_ = uVar131;
                auVar64._10_4_ = auVar56._10_4_;
                auVar111._6_8_ = 0;
                auVar111._0_6_ = auVar64._8_6_;
                auVar164._6_8_ = SUB148(auVar111 << 0x40,6);
                auVar164._4_2_ = (short)(uVar131 >> 0x10);
                auVar164._0_2_ = (ushort)uVar131;
                auVar164._2_2_ = 0;
                auVar164._14_2_ = 0;
                auVar216 = pmaddwd(auVar164,auVar184);
                lVar121 = lVar119 * 4;
                iVar152 = *(int *)((long)&ptr + lVar121 + 4);
                iVar153 = *(int *)((long)&uStack_2f0 + lVar121);
                iVar123 = *(int *)((long)&uStack_2f0 + lVar121 + 4);
                lVar128 = lVar119 * 4;
                *(int *)((long)&ptr + lVar128) = auVar216._0_4_ + *(int *)((long)&ptr + lVar121);
                *(int *)((long)&ptr + lVar128 + 4) = auVar216._4_4_ + iVar152;
                *(int *)((long)&uStack_2f0 + lVar128) = auVar216._8_4_ + iVar153;
                *(int *)((long)&uStack_2f0 + lVar128 + 4) = auVar216._12_4_ + iVar123;
                lVar119 = lVar119 + 4;
              } while (lVar119 != 0x10);
              pvVar124 = (void *)((long)pvVar124 + 1);
              lVar135 = lVar135 + local_1c8;
              pvVar129 = (void *)((long)pvVar129 + sVar5 * (long)local_2a8);
            } while (pvVar124 != local_1d0);
          }
          lVar135 = 0;
          do {
            *(undefined4 *)((long)pvVar140 + lVar135 * 4) =
                 *(undefined4 *)((long)&ptr + lVar135 * 4);
            lVar135 = lVar135 + 1;
          } while (lVar135 != 0x10);
          pvVar122 = (void *)((long)pvVar122 + 1);
          pvVar140 = (void *)((long)pvVar140 + 0x40);
        } while (pvVar122 != local_220);
      }
      local_318 = (void *)((long)local_318 + (long)local_230);
      local_300 = (void *)((long)local_300 + (long)local_230);
      local_288 = (void *)((long)local_288 + (long)local_238);
      uVar131 = local_1f8 + 1;
    } while ((long)(local_1f8 + 1) < (long)local_210);
  }
  pvStack_2e8 = (void *)0x0;
  iStack_2e0 = 0;
  ptr = (void *)0x0;
  uStack_2f0._0_4_ = 0;
  uStack_2f0._4_4_ = 0;
  local_2d8 = (undefined1  [16])0x0;
  local_2c8 = (undefined1  [16])0x0;
  if (local_2b0 == (int *)0x0) {
    pAVar125 = (Allocator *)0x0;
  }
  else {
    LOCK();
    *local_2b0 = *local_2b0 + -1;
    UNLOCK();
    if (*local_2b0 == 0) {
      if (local_270 == (Allocator *)0x0) {
        if (local_330 != (void *)0x0) {
          free(local_330);
        }
      }
      else {
        (**(code **)(*(long *)local_270 + 0x18))(local_270,local_330);
      }
    }
    pAVar125 = (Allocator *)local_2d8._0_8_;
  }
  pvVar140 = ptr;
  local_2b0 = (int *)CONCAT44(uStack_2f0._4_4_,(undefined4)uStack_2f0);
  if (local_2b0 != (int *)0x0) {
    LOCK();
    *local_2b0 = *local_2b0 + -1;
    UNLOCK();
    if (*local_2b0 == 0) {
      if ((Allocator *)local_2d8._0_8_ == (Allocator *)0x0) {
        if (ptr != (void *)0x0) {
          free(ptr);
        }
      }
      else {
        (**(code **)(*(long *)local_2d8._0_8_ + 0x18))();
      }
    }
  }
  local_2d8._0_8_ = local_250->workspace_allocator;
  ptr = (void *)0x0;
  uStack_2f0._0_4_ = 0;
  uStack_2f0._4_4_ = 0;
  uStack_2f0 = (int *)0x0;
  pvStack_2e8 = (void *)0x4;
  iStack_2e0 = 1;
  local_2d8._8_4_ = 3;
  local_2d8._12_4_ = (int)local_110;
  local_2c8._4_4_ = (int)local_268;
  local_2c8._0_4_ = local_1ac;
  local_2c8._8_8_ = (long)(int)(local_1ac * (int)local_110) & 0x3ffffffffffffffc;
  lVar134 = local_2c8._8_8_ * local_210;
  local_270 = pAVar125;
  if (lVar134 != 0) {
    sVar1 = lVar134 * 4 + 4;
    if ((Allocator *)local_2d8._0_8_ == (Allocator *)0x0) {
      asVar144[0] = 0;
      asVar144[1] = 0;
      asVar144[2] = 0;
      asVar144[3] = 0;
      auVar112._8_8_ = 0;
      auVar112._0_8_ = uStack_150;
      _d1 = auVar112 << 0x40;
      iVar152 = posix_memalign((void **)d1,0x10,sVar1);
      ptr = (void *)asVar144;
      if (iVar152 == 0) {
        ptr = (void *)d1;
      }
    }
    else {
      ptr = (void *)(**(code **)(*(long *)local_2d8._0_8_ + 0x10))(local_2d8._0_8_,sVar1);
    }
    uStack_2f0 = (int *)(lVar134 * 4 + (long)ptr);
    *(undefined4 *)((long)ptr + lVar134 * 4) = 1;
  }
  pAVar125 = local_270;
  if (0 < (int)local_268) {
    local_290 = local_290 * 4;
    uVar131 = 1;
    if (1 < (int)local_25c) {
      uVar131 = (ulong)local_25c;
    }
    uVar147 = 1;
    if (1 < (int)uVar149) {
      uVar147 = (ulong)uVar149;
    }
    local_220 = ptr;
    local_278 = pvStack_2e8;
    local_280 = (void *)(local_2c8._8_8_ * (long)pvStack_2e8);
    local_308 = (long)local_328 + 0x30;
    local_2a0 = (void *)((long)(int)local_25c * 0x40);
    local_2a8 = (void *)0x0;
    do {
      if (0 < (int)local_1f0) {
        uVar151 = 0;
        lVar134 = local_308;
        do {
          if (0 < (int)local_1b8) {
            puVar145 = (undefined8 *)
                       ((long)ptr +
                       (uVar151 * 2 + 1) * (long)(int)local_2d8._12_4_ * (long)pvStack_2e8 +
                       (long)local_280 * (long)local_2a8);
            puVar142 = (undefined8 *)
                       ((long)ptr +
                       uVar151 * 2 * (long)(int)local_2d8._12_4_ * (long)pvStack_2e8 +
                       (long)local_280 * (long)local_2a8);
            uVar130 = 0;
            lVar146 = lVar134;
            do {
              lVar137 = 0;
              do {
                *(undefined4 *)((long)d1 + lVar137) = *(undefined4 *)(lVar146 + -0x30 + lVar137);
                *(undefined4 *)((long)d2 + lVar137) = *(undefined4 *)(lVar146 + -0x20 + lVar137);
                *(undefined4 *)((long)d3 + lVar137) = *(undefined4 *)(lVar146 + -0x10 + lVar137);
                *(undefined4 *)((long)s3 + lVar137) = *(undefined4 *)(lVar146 + lVar137);
                lVar137 = lVar137 + 4;
              } while (lVar137 != 0x10);
              iVar152 = (d2._4_4_ - d3._4_4_) + s3[1];
              iVar153 = (aiStack_e0[0] - aiStack_a0[0]) + s3[2];
              local_f0 = (aiStack_e0[1] - aiStack_a0[1]) + s3[3];
              iVar123 = d1._4_4_ + d2._4_4_ + d3._4_4_;
              iVar166 = (int)uStack_150 + aiStack_e0[0] + aiStack_a0[0];
              local_ec = uStack_150._4_4_ + aiStack_e0[1] + aiStack_a0[1];
              o1[0] = (iVar123 - iVar166) + local_ec;
              o1[1] = (iVar152 - iVar153) + local_f0;
              *puVar142 = CONCAT44((d2._0_4_ - d3._0_4_) + s3[0] + iVar152 + iVar153 >> 2,
                                   d1._0_4_ + d2._0_4_ + d3._0_4_ + iVar123 + iVar166 >> 2);
              *puVar145 = CONCAT44(o1[1] >> 2,o1[0] >> 2);
              puVar142 = puVar142 + 1;
              puVar145 = puVar145 + 1;
              uVar130 = uVar130 + 1;
              lVar146 = lVar146 + 0x40;
            } while (uVar130 != uVar131);
          }
          uVar151 = uVar151 + 1;
          lVar134 = lVar134 + (long)local_2a0;
        } while (uVar151 != uVar147);
      }
      local_2a8 = (void *)((long)local_2a8 + 1);
      local_308 = local_308 + local_290;
    } while (local_2a8 != local_268);
  }
  copy_cut_border((Mat *)&ptr,local_118,0,local_2c8._0_4_ - local_118->h,0,
                  local_2d8._12_4_ - local_118->w,local_250);
  if (uStack_2f0 != (int *)0x0) {
    LOCK();
    *uStack_2f0 = *uStack_2f0 + -1;
    UNLOCK();
    if (*uStack_2f0 == 0) {
      if ((Allocator *)local_2d8._0_8_ == (Allocator *)0x0) {
        if (ptr != (void *)0x0) {
          free(ptr);
        }
      }
      else {
        (**(code **)(*(long *)local_2d8._0_8_ + 0x18))();
      }
    }
  }
  if (local_258 != (int *)0x0) {
    LOCK();
    *local_258 = *local_258 + -1;
    UNLOCK();
    if (*local_258 == 0) {
      if (local_218 == (Allocator *)0x0) {
        if (local_328 != (void *)0x0) {
          free(local_328);
        }
      }
      else {
        (**(code **)(*(long *)local_218 + 0x18))(local_218,local_328);
      }
    }
  }
  if (local_2b0 != (int *)0x0) {
    LOCK();
    *local_2b0 = *local_2b0 + -1;
    UNLOCK();
    if (*local_2b0 == 0) {
      if (pAVar125 == (Allocator *)0x0) {
        if (pvVar140 != (void *)0x0) {
          free(pvVar140);
        }
      }
      else {
        (**(code **)(*(long *)pAVar125 + 0x18))(pAVar125,pvVar140);
      }
    }
  }
  if (local_1a8.refcount != (int *)0x0) {
    LOCK();
    *local_1a8.refcount = *local_1a8.refcount + -1;
    UNLOCK();
    if (*local_1a8.refcount == 0) {
      if (local_1a8.allocator == (Allocator *)0x0) {
        if (local_1a8.data != (void *)0x0) {
          free(local_1a8.data);
        }
      }
      else {
        (**(code **)(*(long *)local_1a8.allocator + 0x18))();
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_int8_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2, winograd F(2,3)
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    Option opt_b = opt;
    opt_b.blob_allocator = opt.workspace_allocator;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, 0, 0.f, opt_b);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm/4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/4;

        const int tiles = nColBlocks * nRowBlocks;

        bottom_blob_tm.create(4*4, tiles, inch, 2u, opt.workspace_allocator);

        // BT
        // const float itm[4][4] = {
        //     {1.0f,  0.0f, -1.0f,  0.0f},
        //     {0.0f,  1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  1.00f, 0.0f},
        //     {0.0f, -1.0f,  0.00f, 1.0f}
        // };
        
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<inch; q++)
        {
            const signed char* img = bottom_blob_bordered.channel(q);
            short* out_tm0 = bottom_blob_tm.channel(q);

            for (int j = 0; j < nColBlocks; j++)
            {
                const signed char* r0 = img + w * j * 2;
                const signed char* r1 = r0 + w;
                const signed char* r2 = r1 + w;
                const signed char* r3 = r2 + w;

                for (int i = 0; i < nRowBlocks; i++)
                {
                    short d0[4],d1[4],d2[4],d3[4];
                    short w0[4],w1[4],w2[4],w3[4];
                    short t0[4],t1[4],t2[4],t3[4];
                    // load 
                    for (int n = 0; n < 4; n++)
                    {
                        d0[n] = r0[n];
                        d1[n] = r1[n];
                        d2[n] = r2[n];
                        d3[n] = r3[n];
                    }                                  
                    // w = B_t * d
                    for (int n = 0; n < 4; n++)
                    {   
                        w0[n] = d0[n] - d2[n];
                        w1[n] = d1[n] + d2[n];
                        w2[n] = d2[n] - d1[n];
                        w3[n] = d3[n] - d1[n];
                    }                                
                    // transpose d to d_t
                    {
                        t0[0]=w0[0]; t1[0]=w0[1]; t2[0]=w0[2]; t3[0]=w0[3];
                        t0[1]=w1[0]; t1[1]=w1[1]; t2[1]=w1[2]; t3[1]=w1[3];
                        t0[2]=w2[0]; t1[2]=w2[1]; t2[2]=w2[2]; t3[2]=w2[3];
                        t0[3]=w3[0]; t1[3]=w3[1]; t2[3]=w3[2]; t3[3]=w3[3];
                    }
                    // U = B_t * d_t
                    for (int n = 0; n < 4; n++)
                    {   
                        d0[n] = t0[n] - t2[n];
                        d1[n] = t1[n] + t2[n];
                        d2[n] = t2[n] - t1[n];
                        d3[n] = t3[n] - t1[n];
                    }                
                    // save to out_tm
                    for (int n = 0; n < 4; n++)
                    {
                        out_tm0[n   ] = d0[n];
                        out_tm0[n+ 4] = d1[n];
                        out_tm0[n+ 8] = d2[n];
                        out_tm0[n+12] = d3[n];
                    }                  

                    r0 += 2;
                    r1 += 2;
                    r2 += 2;
                    r3 += 2;

                    out_tm0 += 16;
                }
            }
        }
    }
    bottom_blob_bordered = Mat();
    
    // BEGIN dot
    Mat top_blob_tm;
    {
        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm/4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/4;

        const int tiles = nColBlocks * nRowBlocks; 

        top_blob_tm.create(16, tiles, outch, 4u, opt.workspace_allocator);

        int nn_outch = outch >> 2;
        int remain_outch_start = nn_outch << 2;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp=0; pp<nn_outch; pp++)
        {
            int p = pp * 4;

            Mat out0_tm = top_blob_tm.channel(p);
            Mat out1_tm = top_blob_tm.channel(p+1);
            Mat out2_tm = top_blob_tm.channel(p+2);
            Mat out3_tm = top_blob_tm.channel(p+3);

            const Mat kernel0_tm = kernel_tm.channel(p);
            const Mat kernel1_tm = kernel_tm.channel(p+1);
            const Mat kernel2_tm = kernel_tm.channel(p+2);
            const Mat kernel3_tm = kernel_tm.channel(p+3);

            for (int i=0; i<tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);
                int* output1_tm = out1_tm.row<int>(i);
                int* output2_tm = out2_tm.row<int>(i);
                int* output3_tm = out3_tm.row<int>(i);

                int sum0[16] = {0};
                int sum1[16] = {0};
                int sum2[16] = {0};
                int sum3[16] = {0};

                int q = 0;
                for (; q+3<inch; q+=4)
                {   
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q+1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q+2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q+3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n=0; n<16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r1[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r2[n] * k0[n];
                        k0 += 16;
                        sum0[n] += (int)r3[n] * k0[n];
                        k0 -= 16 * 3;

                        sum1[n] += (int)r0[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r1[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r2[n] * k1[n];
                        k1 += 16;
                        sum1[n] += (int)r3[n] * k1[n];
                        k1 -= 16 * 3;

                        sum2[n] += (int)r0[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r1[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r2[n] * k2[n];
                        k2 += 16;
                        sum2[n] += (int)r3[n] * k2[n];
                        k2 -= 16 * 3;

                        sum3[n] += (int)r0[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r1[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r2[n] * k3[n];
                        k3 += 16;
                        sum3[n] += (int)r3[n] * k3[n];
                        k3 -= 16 * 3;
                    }
                }

                for (; q<inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel1_tm.row<short>(q);
                    const short* k2 = kernel2_tm.row<short>(q);
                    const short* k3 = kernel3_tm.row<short>(q);

                    for (int n=0; n<16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum1[n] += (int)r0[n] * k1[n];
                        sum2[n] += (int)r0[n] * k2[n];
                        sum3[n] += (int)r0[n] * k3[n];
                    }
                }

                for (int n=0; n<16; n++)
                {
                    output0_tm[n] = sum0[n];
                    output1_tm[n] = sum1[n];
                    output2_tm[n] = sum2[n];
                    output3_tm[n] = sum3[n];
                }
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=remain_outch_start; p<outch; p++)
        {
            Mat out0_tm = top_blob_tm.channel(p);
            const Mat kernel0_tm = kernel_tm.channel(p);

            for (int i=0; i<tiles; i++)
            {
                int* output0_tm = out0_tm.row<int>(i);

                int sum0[16] = {0};

                int q = 0;
                for (; q+3<inch; q+=4)
                {   
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* r1 = bottom_blob_tm.channel(q+1).row<short>(i);
                    const short* r2 = bottom_blob_tm.channel(q+2).row<short>(i);
                    const short* r3 = bottom_blob_tm.channel(q+3).row<short>(i);

                    const short* k0 = kernel0_tm.row<short>(q);
                    const short* k1 = kernel0_tm.row<short>(q+1);
                    const short* k2 = kernel0_tm.row<short>(q+2);
                    const short* k3 = kernel0_tm.row<short>(q+3);

                    for (int n=0; n<16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                        sum0[n] += (int)r1[n] * k1[n];
                        sum0[n] += (int)r2[n] * k2[n];
                        sum0[n] += (int)r3[n] * k3[n];
                    }
                }

                for (; q<inch; q++)
                {
                    const short* r0 = bottom_blob_tm.channel(q).row<short>(i);
                    const short* k0 = kernel0_tm.row<short>(q);

                    for (int n=0; n<16; n++)
                    {
                        sum0[n] += (int)r0[n] * k0[n];
                    }             
                }

                for (int n=0; n<16; n++)
                {
                    output0_tm[n] = sum0[n];
                }
            }
        }
    }
    bottom_blob_tm = Mat();
    // END dot    

    // BEGIN transform output
    Mat top_blob_bordered;
    top_blob_bordered.create(outw, outh, outch, 4u, opt.workspace_allocator);
    {
        // AT
        // const float itm[2][4] = {
        //     {1.0f,  1.0f,  1.0f,  0.0f},
        //     {0.0f,  1.0f, -1.0f,  1.0f}
        // }; 

        int w_tm = outw / 2 * 4;
        int h_tm = outh / 2 * 4;

        int nColBlocks = h_tm/4; // may be the block num in Feathercnn
        int nRowBlocks = w_tm/4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p=0; p<outch; p++)
        {
            Mat out_tm = top_blob_tm.channel(p);
            Mat out = top_blob_bordered.channel(p);

            for (int j=0; j<nColBlocks; j++)
            {
                int* outRow0 = out.row<int>(j*2);
                int* outRow1 = out.row<int>(j*2+1);

                for(int i=0; i<nRowBlocks; i++)
                {
                    int* out_tile = out_tm.row<int>(j*nRowBlocks + i);

                    int s0[4],s1[4],s2[4],s3[4];
                    int w0[4],w1[4];
                    int d0[2],d1[2],d2[2],d3[2];
                    int o0[2],o1[2];
                    // load
                    for (int n = 0; n < 4; n++)
                    {
                        s0[n] = out_tile[n];
                        s1[n] = out_tile[n+ 4];
                        s2[n] = out_tile[n+ 8];
                        s3[n] = out_tile[n+12];
                    }
                    // w = A_T * W
                    for (int n = 0; n < 4; n++)
                    {
                        w0[n] = s0[n] + s1[n] + s2[n];
                        w1[n] = s1[n] - s2[n] + s3[n];
                    }
                    // transpose w to w_t
                    {
                        d0[0] = w0[0]; d0[1] = w1[0];
                        d1[0] = w0[1]; d1[1] = w1[1];
                        d2[0] = w0[2]; d2[1] = w1[2];
                        d3[0] = w0[3]; d3[1] = w1[3];
                    }
                    // Y = A_T * w_t
                    for (int n = 0; n < 2; n++)
                    {
                        o0[n] = d0[n] + d1[n] + d2[n];
                        o1[n] = d1[n] - d2[n] + d3[n];
                    }
                    // save to top blob tm,why right 2,because the G' = G*2
                    outRow0[0] = o0[0] >> 2;
                    outRow0[1] = o0[1] >> 2;
                    outRow1[0] = o1[0] >> 2;
                    outRow1[1] = o1[1] >> 2;

                    outRow0 += 2;
                    outRow1 += 2;           
                }
            }
        }        
    }
    // END transform output 

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}